

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O1

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
pong<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,span<const_unsigned_char,__1L> *payload)

{
  descriptor<pstore::details::posix_descriptor_traits> dVar1;
  long lVar2;
  undefined8 *puVar3;
  span<const_unsigned_char,__1L> *in_R9;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar4;
  long *in_FS_OFFSET;
  
  dVar1 = *io._M_data;
  pstore::details::log_destinations::__tls_init();
  lVar2 = *in_FS_OFFSET;
  if (*(long *)(lVar2 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar4 = *(undefined8 **)(lVar2 + -8);
    puVar3 = (undefined8 *)puVar4[1];
    for (puVar4 = (undefined8 *)*puVar4; puVar4 != puVar3; puVar4 = puVar4 + 1) {
      (**(code **)(*(long *)*puVar4 + 0x28))((long *)*puVar4,6,"Sending pong. Length=",dVar1);
    }
  }
  send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (__return_storage_ptr__,this,sender,
             (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
              )0xa,(opcode)io._M_data,in_R9);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> pong (Sender const sender, IO const io,
                           gsl::span<std::uint8_t const> const & payload) {
            log (logger::priority::info, "Sending pong. Length=", payload.size ());
            return send_message (sender, io, opcode::pong, payload);
        }